

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cencode.c
# Opt level: O1

void rcnb_encode_byte(uchar value_in,wchar_t **value_out)

{
  ushort uVar1;
  wchar_t wVar2;
  wchar_t *pwVar3;
  unsigned_short *puVar4;
  wchar_t *pwVar5;
  
  if ((char)value_in < '\0') {
    value_in = value_in & 0x7f;
    pwVar3 = L"bBƀƁƃƄƅßÞþ";
    pwVar5 = L"nNŃńŅņŇňƝƞÑǸǹȠȵ";
    puVar4 = &sb;
  }
  else {
    pwVar3 = L"cCĆćĈĉĊċČčƇƈÇȻȼ";
    pwVar5 = L"rRŔŕŖŗŘřƦȐȑȒȓɌɍ";
    puVar4 = &sc;
  }
  uVar1 = *puVar4;
  wVar2 = pwVar5[(ulong)value_in / (ulong)uVar1];
  pwVar5 = *value_out;
  *value_out = pwVar5 + 1;
  *pwVar5 = wVar2;
  wVar2 = pwVar3[(ulong)value_in % (ulong)uVar1];
  *value_out = pwVar5 + 2;
  pwVar5[1] = wVar2;
  return;
}

Assistant:

void rcnb_encode_byte(unsigned char value_in, wchar_t** value_out)
{
    if (value_in > 0x7F) {
        value_in = (unsigned char)(value_in & 0x7F);
        *(*value_out)++ = cn[value_in / sb];
        *(*value_out)++ = cb[value_in % sb];
        return;
    }
    *(*value_out)++ = cr[value_in / sc];
    *(*value_out)++ = cc[value_in % sc];
}